

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void testing::internal::MatcherBase<std::pair<int,phmap::priv::NonStandardLayout>const&>::
     ValuePolicy<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>,false>
     ::Init<testing::internal::EqMatcher<std::pair<int,phmap::priv::NonStandardLayout>>>
               (MatcherBase<const_std::pair<int,_phmap::priv::NonStandardLayout>_&> *m,
               EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_> *arg)

{
  pointer pcVar1;
  undefined4 *puVar2;
  
  puVar2 = (undefined4 *)operator_new(0x38);
  *puVar2 = 1;
  puVar2[2] = (arg->
              super_ComparisonBase<testing::internal::EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_>,_std::pair<int,_phmap::priv::NonStandardLayout>,_std::equal_to<void>_>
              ).rhs_.first;
  *(undefined ***)(puVar2 + 4) = &PTR__NonStandardLayout_00345320;
  *(undefined4 **)(puVar2 + 6) = puVar2 + 10;
  pcVar1 = (arg->
           super_ComparisonBase<testing::internal::EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_>,_std::pair<int,_phmap::priv::NonStandardLayout>,_std::equal_to<void>_>
           ).rhs_.second.value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 6),pcVar1,
             pcVar1 + (arg->
                      super_ComparisonBase<testing::internal::EqMatcher<std::pair<int,_phmap::priv::NonStandardLayout>_>,_std::pair<int,_phmap::priv::NonStandardLayout>,_std::equal_to<void>_>
                      ).rhs_.second.value._M_string_length);
  (m->buffer_).ptr = puVar2;
  return;
}

Assistant:

static void Init(MatcherBase& m, Arg&& arg) {
      m.buffer_.shared = new Shared(std::forward<Arg>(arg));
    }